

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastMdS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TcParseTableBase *pTVar6;
  MessageLite *pMVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  string *psVar11;
  Arena *arena;
  uint *puVar12;
  long *plVar13;
  ushort *puVar14;
  pair<const_char_*,_int> pVar15;
  int local_40;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar12 & 3) != 0) {
      AlignFail();
    }
    *puVar12 = *puVar12 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar13 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar13 & 7) != 0) {
    AlignFail(plVar13);
  }
  pTVar6 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  if (*plVar13 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar7 = ClassData::New(pTVar6->class_data,arena);
    *plVar13 = (long)pMVar7;
  }
  if (ptr[1] < '\0') {
    pVar15 = ReadSizeFallback(ptr + 1,(uint)(byte)ptr[1]);
    puVar14 = (ushort *)pVar15.first;
    if (puVar14 == (ushort *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    puVar14 = (ushort *)(ptr + 2);
  }
  if (0 < ctx->depth_) {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)ctx,(int)puVar14);
    iVar2 = local_40;
    lVar8 = (long)ctx->depth_ + -1;
    iVar4 = (int)lVar8;
    ctx->depth_ = iVar4;
    pMVar7 = (MessageLite *)*plVar13;
    _local_40 = puVar14;
    while (bVar3 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffc0,
                              ctx->group_depth_), !bVar3) {
      uVar5 = (uint)pTVar6->fast_idx_mask & (uint)*_local_40;
      if ((uVar5 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar9 = (ulong)(uVar5 & 0xfffffff8);
      _local_40 = (ushort *)
                  (**(code **)(&pTVar6[1].has_bits_offset + uVar9))
                            (pMVar7,_local_40,ctx,
                             (ulong)*_local_40 ^ *(ulong *)(&pTVar6[1].fast_idx_mask + uVar9 * 2),
                             pTVar6,0);
      if ((_local_40 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    puVar14 = _local_40;
    if ((pTVar6->field_0x9 & 1) != 0) {
      puVar14 = (ushort *)(*pTVar6->post_loop_handler)(pMVar7,(char *)_local_40,ctx);
    }
    iVar1 = ctx->depth_;
    if ((puVar14 != (ushort *)0x0) && (iVar4 != iVar1)) {
      psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (lVar8,(long)iVar1,"old_depth == depth_");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,1099,*(undefined8 *)(psVar11 + 8),*(undefined8 *)psVar11);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0);
    }
    ctx->depth_ = iVar1 + 1;
    uVar5 = iVar2 + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar5;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar5 >> 0x1f & uVar5);
      return (char *)puVar14;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}